

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

void __thiscall Scene::Scene(Scene *this)

{
  this->_vptr_Scene = (_func_int **)&PTR__Scene_0010ab48;
  (this->light).
  super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->light).
  super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->light).
  super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->solid).
  super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->solid).
  super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->solid).
  super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->envFog).super___shared_ptr<Fog,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->envFog).super___shared_ptr<Fog,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->eye).x = 0.0;
  (this->eye).y = 0.0;
  (this->eye).z = 0.0;
  (this->eye_dir).x = 0.0;
  (this->eye_dir).y = 0.0;
  (this->eye_dir).z = 1.0;
  (this->view_x).x = 1.0;
  (this->view_y).x = 0.0;
  (this->view_x).y = 0.0;
  (this->view_x).z = 0.0;
  (this->view_y).y = 1.0;
  (this->view_y).z = 0.0;
  this->aperture = 0.0;
  this->focus = 0.0;
  (this->ambient).x = 1.0;
  (this->ambient).y = 1.0;
  (this->ambient).z = 1.0;
  (this->background).x = 0.0;
  (this->background).y = 0.05;
  (this->background).z = 0.05;
  return;
}

Assistant:

Scene() {}